

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadline_timer_service.hpp
# Opt level: O0

void __thiscall
asio::detail::
deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::op_cancellation::operator()(op_cancellation *this,cancellation_type_t type)

{
  bool bVar1;
  cancellation_type_t cVar2;
  cancellation_type_t in_ESI;
  void *in_stack_00000018;
  per_timer_data *in_stack_00000020;
  timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *in_stack_00000028;
  epoll_reactor *in_stack_00000030;
  
  cVar2 = operator|(terminal,partial);
  cVar2 = operator|(cVar2,total);
  cVar2 = operator&(in_ESI,cVar2);
  bVar1 = operator!(cVar2);
  if (!bVar1) {
    epoll_reactor::
    cancel_timer_by_key<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
  }
  return;
}

Assistant:

void operator()(cancellation_type_t type)
    {
      if (!!(type &
            (cancellation_type::terminal
              | cancellation_type::partial
              | cancellation_type::total)))
      {
        service_->scheduler_.cancel_timer_by_key(
            service_->timer_queue_, timer_data_, this);
      }
    }